

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

int __thiscall ncnn::Net::load_param_bin(Net *this,FILE *fp)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  reference ppLVar4;
  long in_RDI;
  int lr;
  int pdlr;
  Blob *blob_1;
  int top_blob_index;
  int j_1;
  Blob *blob;
  int bottom_blob_index;
  int j;
  int custom_index;
  Layer *layer;
  int top_count;
  int bottom_count;
  int typeindex;
  int i;
  ParamDict pd;
  int blob_count;
  int layer_count;
  int magic;
  Layer *in_stack_fffffffffffff9a0;
  int in_stack_fffffffffffff9a8;
  int in_stack_fffffffffffff9ac;
  int in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b4;
  int in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9bc;
  Layer *in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9e0;
  int in_stack_fffffffffffff9e4;
  int local_610;
  int local_60c;
  int local_5fc;
  int local_5f8;
  Layer *local_5f0;
  int local_5e8;
  int local_5e4;
  uint local_5d0;
  int local_5cc;
  undefined1 local_5c8 [1444];
  undefined4 local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  local_1c = 0;
  bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                         (FILE *)in_stack_fffffffffffff9a0);
  if (bVar1) {
    if (local_1c == 0x7685dd) {
      local_20 = 0;
      bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                             (FILE *)in_stack_fffffffffffff9a0);
      if (bVar1) {
        local_24 = 0;
        bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
                               (FILE *)in_stack_fffffffffffff9a0);
        if (bVar1) {
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                     in_stack_fffffffffffff9c0,
                     CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                    ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)in_stack_fffffffffffff9c0,
                     CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          ParamDict::ParamDict
                    ((ParamDict *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
          for (local_5cc = 0; local_5cc < local_20; local_5cc = local_5cc + 1) {
            bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,
                                                   in_stack_fffffffffffff9a8),
                                   (FILE *)in_stack_fffffffffffff9a0);
            if (!bVar1) {
              local_4 = -1;
              goto LAB_0012a2c7;
            }
            bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,
                                                   in_stack_fffffffffffff9a8),
                                   (FILE *)in_stack_fffffffffffff9a0);
            if (!bVar1) {
              local_4 = -1;
              goto LAB_0012a2c7;
            }
            bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,
                                                   in_stack_fffffffffffff9a8),
                                   (FILE *)in_stack_fffffffffffff9a0);
            if (!bVar1) {
              local_4 = -1;
              goto LAB_0012a2c7;
            }
            local_5f0 = create_layer(in_stack_fffffffffffff9ac);
            if (local_5f0 == (Layer *)0x0) {
              in_stack_fffffffffffff9c0 =
                   create_custom_layer((Net *)CONCAT44(in_stack_fffffffffffff9ac,
                                                       in_stack_fffffffffffff9a8),
                                       (int)((ulong)in_stack_fffffffffffff9a0 >> 0x20));
              local_5f0 = in_stack_fffffffffffff9c0;
            }
            if (local_5f0 == (Layer *)0x0) {
              fprintf(_stderr,"layer %d not exists or registered\n",(ulong)local_5d0);
              clear((Net *)CONCAT44(in_stack_fffffffffffff9e4,in_stack_fffffffffffff9e0));
              local_4 = -1;
              goto LAB_0012a2c7;
            }
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0,
                       CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
            for (local_5f8 = 0; local_5f8 < local_5e4; local_5f8 = local_5f8 + 1) {
              bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,
                                                     in_stack_fffffffffffff9a8),
                                     (FILE *)in_stack_fffffffffffff9a0);
              in_stack_fffffffffffff9bc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9bc);
              if (!bVar1) {
                local_4 = -1;
                goto LAB_0012a2c7;
              }
              std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                        ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x10),
                         (long)local_5fc);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0),
                         (value_type_conflict *)
                         CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8));
              in_stack_fffffffffffff9b8 = local_5fc;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_5f0->bottoms,(long)local_5f8);
              *pvVar2 = in_stack_fffffffffffff9b8;
            }
            std::vector<int,_std::allocator<int>_>::resize
                      ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9c0,
                       CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
            for (local_60c = 0; local_60c < local_5e8; local_60c = local_60c + 1) {
              bVar1 = readValue<int>((int *)CONCAT44(in_stack_fffffffffffff9ac,
                                                     in_stack_fffffffffffff9a8),
                                     (FILE *)in_stack_fffffffffffff9a0);
              in_stack_fffffffffffff9b4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff9b4);
              if (!bVar1) {
                local_4 = -1;
                goto LAB_0012a2c7;
              }
              pvVar3 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                 ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x10)
                                  ,(long)local_610);
              pvVar3->producer = local_5cc;
              in_stack_fffffffffffff9b0 = local_610;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&local_5f0->tops,(long)local_60c);
              *pvVar2 = in_stack_fffffffffffff9b0;
            }
            in_stack_fffffffffffff9ac =
                 ParamDict::load_param_bin
                           ((ParamDict *)in_stack_fffffffffffff9c0,
                            (FILE *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
            in_stack_fffffffffffff9e4 = in_stack_fffffffffffff9ac;
            if (in_stack_fffffffffffff9ac == 0) {
              in_stack_fffffffffffff9a8 = (*local_5f0->_vptr_Layer[2])(local_5f0,local_5c8);
              in_stack_fffffffffffff9e0 = in_stack_fffffffffffff9a8;
              if (in_stack_fffffffffffff9a8 == 0) {
                ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                                     (in_RDI + 0x28),(long)local_5cc);
                *ppLVar4 = local_5f0;
              }
              else {
                fprintf(_stderr,"layer load_param failed\n");
                local_5f0 = in_stack_fffffffffffff9a0;
              }
            }
            else {
              fprintf(_stderr,"ParamDict load_param failed\n");
              local_5f0 = in_stack_fffffffffffff9a0;
            }
            in_stack_fffffffffffff9a0 = local_5f0;
          }
          local_4 = 0;
LAB_0012a2c7:
          ParamDict::~ParamDict
                    ((ParamDict *)CONCAT44(in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0));
        }
        else {
          local_4 = -1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    else {
      fprintf(_stderr,"param is too old, please regenerate\n");
      local_4 = -1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int Net::load_param_bin(FILE* fp)
{
    int magic = 0;
    if (!readValue(magic, fp))
        return -1;
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    if (!readValue(layer_count, fp))
        return -1;

    int blob_count = 0;
    if (!readValue(blob_count, fp))
        return -1;

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (use_vulkan_compute && !vkdev)
    {
        // use default vulkan device
        if (!vkdev_local)
            vkdev_local = new VulkanDevice;
        vkdev = vkdev_local;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        if (!readValue(typeindex, fp))
            return -1;

        int bottom_count;
        if (!readValue(bottom_count, fp))
            return -1;

        int top_count;
        if (!readValue(top_count, fp))
            return -1;

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            if (!readValue(bottom_blob_index, fp))
                return -1;

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            if (!readValue(top_blob_index, fp))
                return -1;

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(fp);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

    return 0;
}